

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesCacheEntryComposite.cxx
# Opt level: O3

void __thiscall
cmCursesCacheEntryComposite::cmCursesCacheEntryComposite
          (cmCursesCacheEntryComposite *this,string *key,cmState *state,bool isNew,int labelwidth,
          int entrywidth)

{
  pointer pcVar1;
  _Head_base<0UL,_cmCursesLabelWidget_*,_false> _Var2;
  cmCursesLabelWidget *pcVar3;
  cmCursesWidget *pcVar4;
  bool value;
  CacheEntryType CVar5;
  _Head_base<0UL,_cmCursesLabelWidget_*,_false> this_00;
  cmCursesLabelWidget *this_01;
  cmValue value_00;
  cmValue cVar6;
  cmCursesPathWidget *this_02;
  char *extraout_RDX;
  pointer *__ptr;
  string *opt;
  string *option;
  string_view value_01;
  string_view arg;
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  string *local_38;
  
  local_38 = &this->Key;
  local_40 = &(this->Key).field_2;
  (this->Label)._M_t.
  super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
  super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl = (cmCursesLabelWidget *)0x0;
  (this->IsNewLabel)._M_t.
  super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
  super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl = (cmCursesLabelWidget *)0x0;
  (this->Entry)._M_t.super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>.
  _M_t.super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
  super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl = (cmCursesWidget *)0x0;
  (this->Key)._M_dataplus._M_p = (pointer)local_40;
  pcVar1 = (key->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + key->_M_string_length);
  this->LabelWidth = labelwidth;
  this->EntryWidth = entrywidth;
  this_00._M_head_impl = (cmCursesLabelWidget *)operator_new(0x40);
  cmCursesLabelWidget::cmCursesLabelWidget(this_00._M_head_impl,labelwidth,1,1,1,key);
  _Var2._M_head_impl =
       (this->Label)._M_t.
       super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
       super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
       super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl;
  (this->Label)._M_t.
  super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
  super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl = this_00._M_head_impl;
  if (_Var2._M_head_impl != (cmCursesLabelWidget *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_cmCursesWidget + 8))();
  }
  if (isNew) {
    this_01 = (cmCursesLabelWidget *)operator_new(0x40);
    local_60._0_8_ = local_60 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"*","");
    cmCursesLabelWidget::cmCursesLabelWidget(this_01,1,1,1,1,(string *)local_60);
  }
  else {
    this_01 = (cmCursesLabelWidget *)operator_new(0x40);
    local_60._0_8_ = local_60 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60," ","");
    cmCursesLabelWidget::cmCursesLabelWidget(this_01,1,1,1,1,(string *)local_60);
  }
  if ((string *)local_60._0_8_ != (string *)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  pcVar3 = (this->IsNewLabel)._M_t.
           super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
           super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl;
  (this->IsNewLabel)._M_t.
  super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
  super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl = this_01;
  if (pcVar3 != (cmCursesLabelWidget *)0x0) {
    (**(code **)((long)(pcVar3->super_cmCursesWidget)._vptr_cmCursesWidget + 8))();
  }
  value_00 = cmState::GetCacheEntryValue(state,key);
  if (value_00.Value == (string *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CursesDialog/cmCursesCacheEntryComposite.cxx"
                  ,0x35,
                  "cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(const std::string &, cmState *, bool, int, int)"
                 );
  }
  CVar5 = cmState::GetCacheEntryType(state,key);
  switch(CVar5) {
  case BOOL:
    this_02 = (cmCursesPathWidget *)operator_new(0x40);
    cmCursesBoolWidget::cmCursesBoolWidget((cmCursesBoolWidget *)this_02,this->EntryWidth,1,1,1);
    value_01._M_str = extraout_RDX;
    value_01._M_len = (size_t)((value_00.Value)->_M_dataplus)._M_p;
    value = cmValue::IsOn((cmValue *)(value_00.Value)->_M_string_length,value_01);
    cmCursesBoolWidget::SetValueAsBool((cmCursesBoolWidget *)this_02,value);
    break;
  case PATH:
    this_02 = (cmCursesPathWidget *)operator_new(0xb8);
    cmCursesPathWidget::cmCursesPathWidget(this_02,this->EntryWidth,1,1,1);
    cmCursesStringWidget::SetString((cmCursesStringWidget *)this_02,value_00.Value);
    break;
  case FILEPATH:
    this_02 = (cmCursesPathWidget *)operator_new(0xb8);
    cmCursesFilePathWidget::cmCursesFilePathWidget
              ((cmCursesFilePathWidget *)this_02,this->EntryWidth,1,1,1);
    cmCursesStringWidget::SetString((cmCursesStringWidget *)this_02,value_00.Value);
    break;
  case STRING:
    local_60._0_8_ = (string *)(local_60 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"STRINGS","");
    cVar6 = cmState::GetCacheEntryProperty(state,key,(string *)local_60);
    if ((string *)local_60._0_8_ != (string *)(local_60 + 0x10)) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    }
    if (cVar6.Value == (string *)0x0) {
      this_02 = (cmCursesPathWidget *)operator_new(0x68);
      cmCursesStringWidget::cmCursesStringWidget
                ((cmCursesStringWidget *)this_02,this->EntryWidth,1,1,1);
      cmCursesStringWidget::SetString((cmCursesStringWidget *)this_02,value_00.Value);
    }
    else {
      this_02 = (cmCursesPathWidget *)operator_new(0x60);
      cmCursesOptionsWidget::cmCursesOptionsWidget
                ((cmCursesOptionsWidget *)this_02,this->EntryWidth,1,1,1);
      arg._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar6.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_60,arg,false);
      for (option = (string *)local_60._0_8_; option != (string *)local_60._8_8_;
          option = option + 1) {
        cmCursesOptionsWidget::AddOption((cmCursesOptionsWidget *)this_02,option);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_60);
      cmCursesOptionsWidget::SetOption((cmCursesOptionsWidget *)this_02,value_00.Value);
    }
    break;
  default:
    goto switchD_00155576_caseD_4;
  case UNINITIALIZED:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   "Found an undefined variable: ",key);
    cmSystemTools::Error((string *)local_60);
    if ((string *)local_60._0_8_ != (string *)(local_60 + 0x10)) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    }
    goto switchD_00155576_caseD_4;
  }
  pcVar4 = (this->Entry)._M_t.
           super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>._M_t.
           super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
           super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl;
  (this->Entry)._M_t.super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>.
  _M_t.super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
  super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl = (cmCursesWidget *)this_02;
  if (pcVar4 != (cmCursesWidget *)0x0) {
    (*pcVar4->_vptr_cmCursesWidget[1])();
  }
switchD_00155576_caseD_4:
  return;
}

Assistant:

cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(
  const std::string& key, cmState* state, bool isNew, int labelwidth,
  int entrywidth)
  : Key(key)
  , LabelWidth(labelwidth)
  , EntryWidth(entrywidth)
{
  this->Label =
    cm::make_unique<cmCursesLabelWidget>(this->LabelWidth, 1, 1, 1, key);
  if (isNew) {
    this->IsNewLabel = cm::make_unique<cmCursesLabelWidget>(1, 1, 1, 1, "*");
  } else {
    this->IsNewLabel = cm::make_unique<cmCursesLabelWidget>(1, 1, 1, 1, " ");
  }

  cmValue value = state->GetCacheEntryValue(key);
  assert(value);
  switch (state->GetCacheEntryType(key)) {
    case cmStateEnums::BOOL: {
      auto bw = cm::make_unique<cmCursesBoolWidget>(this->EntryWidth, 1, 1, 1);
      bw->SetValueAsBool(cmIsOn(*value));
      this->Entry = std::move(bw);
      break;
    }
    case cmStateEnums::PATH: {
      auto pw = cm::make_unique<cmCursesPathWidget>(this->EntryWidth, 1, 1, 1);
      pw->SetString(*value);
      this->Entry = std::move(pw);
      break;
    }
    case cmStateEnums::FILEPATH: {
      auto fpw =
        cm::make_unique<cmCursesFilePathWidget>(this->EntryWidth, 1, 1, 1);
      fpw->SetString(*value);
      this->Entry = std::move(fpw);
      break;
    }
    case cmStateEnums::STRING: {
      cmValue stringsProp = state->GetCacheEntryProperty(key, "STRINGS");
      if (stringsProp) {
        auto ow =
          cm::make_unique<cmCursesOptionsWidget>(this->EntryWidth, 1, 1, 1);
        for (std::string const& opt : cmExpandedList(*stringsProp)) {
          ow->AddOption(opt);
        }
        ow->SetOption(*value);
        this->Entry = std::move(ow);
      } else {
        auto sw =
          cm::make_unique<cmCursesStringWidget>(this->EntryWidth, 1, 1, 1);
        sw->SetString(*value);
        this->Entry = std::move(sw);
      }
      break;
    }
    case cmStateEnums::UNINITIALIZED:
      cmSystemTools::Error("Found an undefined variable: " + key);
      break;
    default:
      // TODO : put warning message here
      break;
  }
}